

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int dotlockClose(sqlite3_file *id)

{
  unixFile *pFile;
  int rc;
  sqlite3_file *id_local;
  
  pFile._4_4_ = 0;
  if (id != (sqlite3_file *)0x0) {
    dotlockUnlock(id,0);
    sqlite3_free(id[5].pMethods);
    pFile._4_4_ = closeUnixFile(id);
  }
  return pFile._4_4_;
}

Assistant:

static int dotlockClose(sqlite3_file *id) {
  int rc = SQLITE_OK;
  if( id ){
    unixFile *pFile = (unixFile*)id;
    dotlockUnlock(id, NO_LOCK);
    sqlite3_free(pFile->lockingContext);
    rc = closeUnixFile(id);
  }
  return rc;
}